

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O2

bool makePattern(CHAR8 *textPattern,vector<unsigned_char,_std::allocator<unsigned_char>_> *pattern,
                vector<unsigned_char,_std::allocator<unsigned_char>_> *patternMask)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  UINTN i;
  ulong uVar5;
  ulong __new_size;
  bool bVar6;
  
  sVar4 = strlen(textPattern);
  if ((sVar4 & 1) == 0 && sVar4 != 0) {
    __new_size = sVar4 >> 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(pattern,__new_size);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(patternMask,__new_size);
    for (uVar5 = 0; bVar6 = __new_size == uVar5, !bVar6; uVar5 = uVar5 + 1) {
      iVar2 = toupper((int)textPattern[uVar5 * 2]);
      iVar2 = char2hex((char)iVar2);
      iVar3 = toupper((int)textPattern[uVar5 * 2 + 1]);
      iVar3 = char2hex((char)iVar3);
      if (iVar2 == -1) {
        return bVar6;
      }
      if (iVar3 == -1) {
        return bVar6;
      }
      if (iVar2 != -2) {
        (patternMask->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar5] = 0xf0;
        (pattern->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar5] = (char)iVar2 << 4;
      }
      if (iVar3 != -2) {
        pbVar1 = (patternMask->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start + uVar5;
        *pbVar1 = *pbVar1 | 0xf;
        pbVar1 = (pattern->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start + uVar5;
        *pbVar1 = *pbVar1 | (byte)iVar3;
      }
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool makePattern(const CHAR8 *textPattern, std::vector<UINT8> &pattern, std::vector<UINT8> &patternMask)
{
    UINTN len = std::strlen(textPattern);
    
    if (len == 0 || len % 2 != 0)
        return false;
    
    len /= 2;
    
    pattern.resize(len);
    patternMask.resize(len);
    
    for (UINTN i = 0; i < len; i++) {
        int v1 = char2hex(std::toupper(textPattern[i * 2]));
        int v2 = char2hex(std::toupper(textPattern[i * 2 + 1]));
        
        if (v1 == -1 || v2 == -1)
            return false;
        
        if (v1 != -2) {
            patternMask[i] = 0xF0;
            pattern[i] = static_cast<UINT8>(v1) << 4;
        }
        
        if (v2 != -2) {
            patternMask[i] |= 0x0F;
            pattern[i] |= static_cast<UINT8>(v2);
        }
    }
    
    return true;
}